

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int __thiscall AActor::GetMissileDamage(AActor *this,int mask,int add)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined8 *in_FS_OFFSET;
  VMValue param;
  int amount;
  VMReturn result;
  anon_union_16_5_cf148060_for_VMValue_0 local_48;
  int local_34;
  VMReturn local_30;
  
  if (this->DamageVal < 0) {
    if (this->DamageFunc == (VMFunction *)0x0) {
      __assert_fail("false && \"No damage function found\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0xd24,"int AActor::GetMissileDamage(int, int)");
    }
    local_48.field_1.atag = 1;
    local_48.field_3.Type = '\x03';
    local_30.Location = &local_34;
    local_30.TagOfs = 0;
    local_30.RegType = '\0';
    local_48.field_1.a = this;
    GlobalVMStack::__tls_init();
    iVar2 = VMFrameStack::Call((VMFrameStack *)*in_FS_OFFSET,this->DamageFunc,
                               (VMValue *)&local_48.field_1,1,&local_30,1,(VMException **)0x0);
    iVar3 = 0;
    if (0 < iVar2) {
      iVar3 = local_34;
    }
    if (local_48.field_3.Type == '\x02') {
      FString::~FString((FString *)&local_48.field_1);
    }
  }
  else if (mask == 0) {
    iVar3 = this->DamageVal * add;
  }
  else {
    uVar1 = FRandom::GenRand32(&pr_missiledamage);
    iVar3 = ((mask & uVar1 & 0xff) + add) * this->DamageVal;
  }
  return iVar3;
}

Assistant:

int AActor::GetMissileDamage (int mask, int add)
{
	if (DamageVal >= 0)
	{
		if (mask == 0)
		{
			return add * DamageVal;
		}
		else
		{
			return ((pr_missiledamage() & mask) + add) * DamageVal;
		}
	}
	if (DamageFunc == nullptr)
	{
		// This should never happen
		assert(false && "No damage function found");
		return 0;
	}
	VMValue param = this;
	VMReturn result;

	int amount;

	result.IntAt(&amount);

	if (GlobalVMStack.Call(DamageFunc, &param, 1, &result, 1) < 1)
	{ // No results
		return 0;
	}
	return amount;
}